

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O1

GLvoid __thiscall gl4cts::anon_unknown_0::GatherBase::CreateTexture2DInt(GatherBase *this,bool rect)

{
  CallLogWrapper *this_00;
  int i_1;
  int internalformat;
  long lVar1;
  GLenum target;
  undefined7 in_register_00000031;
  int i;
  int iVar2;
  ulong uVar3;
  allocator_type local_81;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> pixels;
  IVec4 data [4];
  
  internalformat = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x21])()
  ;
  iVar2 = (int)CONCAT71(in_register_00000031,rect);
  target = 0xde1;
  if (iVar2 != 0) {
    target = 0x84f5;
  }
  this_00 = &(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenTextures(this_00,1,&this->tex);
  glu::CallLogWrapper::glBindTexture(this_00,target,this->tex);
  if (iVar2 == 0) {
    uVar3 = 0x20;
    iVar2 = 0;
    do {
      glu::CallLogWrapper::glTexImage2D
                (this_00,target,iVar2,internalformat,(GLsizei)uVar3,(GLsizei)uVar3,0,0x8d99,0x1404,
                 (void *)0x0);
      iVar2 = iVar2 + 1;
      uVar3 = uVar3 >> 1;
    } while (iVar2 != 6);
  }
  else {
    glu::CallLogWrapper::glTexImage2D
              (this_00,target,0,internalformat,0x20,0x20,0,0x8d99,0x1404,(void *)0x0);
  }
  lVar1 = 0;
  do {
    data[0].m_data[lVar1] = 999;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            (&pixels,0x400,data,&local_81);
  glu::CallLogWrapper::glTexSubImage2D
            (this_00,target,0,0,0,0x20,0x20,0x8d99,0x1404,
             pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  data[0].m_data[0] = 0xc;
  data[0].m_data[1] = 0xd;
  data[0].m_data[2] = 0xe;
  data[0].m_data[3] = 0xf;
  data[1].m_data[0] = 8;
  data[1].m_data[1] = 9;
  data[1].m_data[2] = 10;
  data[1].m_data[3] = 0xb;
  data[2].m_data[0] = 0;
  data[2].m_data[1] = 1;
  data[2].m_data[2] = 2;
  data[2].m_data[3] = 3;
  data[3].m_data[0] = 4;
  data[3].m_data[1] = 5;
  data[3].m_data[2] = 6;
  data[3].m_data[3] = 7;
  glu::CallLogWrapper::glTexSubImage2D(this_00,target,0,0x16,0x19,2,2,0x8d99,0x1404,data);
  glu::CallLogWrapper::glTexSubImage2D(this_00,target,0,0x10,10,1,1,0x8d99,0x1404,data);
  glu::CallLogWrapper::glTexSubImage2D(this_00,target,0,0xb,2,1,1,0x8d99,0x1404,data + 1);
  glu::CallLogWrapper::glTexSubImage2D(this_00,target,0,0x18,0xd,1,1,0x8d99,0x1404,data + 2);
  glu::CallLogWrapper::glTexSubImage2D(this_00,target,0,9,0xe,1,1,0x8d99,0x1404,data + 3);
  glu::CallLogWrapper::glTexParameteri(this_00,target,0x2802,0x812f);
  glu::CallLogWrapper::glTexParameteri(this_00,target,0x2803,0x812f);
  glu::CallLogWrapper::glTexParameteri(this_00,target,0x8072,0x812f);
  glu::CallLogWrapper::glTexParameteri(this_00,target,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,target,0x2800,0x2600);
  if (pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(pixels.
                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)pixels.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)pixels.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

virtual GLvoid CreateTexture2DInt(bool rect = false)
	{
		GLenum		internal_format = InternalFormat();
		const GLint csize			= 32;
		GLint		size			= csize;
		GLenum		target			= rect ? GL_TEXTURE_RECTANGLE : GL_TEXTURE_2D;

		glGenTextures(1, &tex);
		glBindTexture(target, tex);
		if (!rect)
		{
			for (int i = 0; size > 0; ++i, size /= 2)
			{
				glTexImage2D(target, i, internal_format, size, size, 0, GL_RGBA_INTEGER, GL_INT, 0);
			}
		}
		else
		{
			glTexImage2D(target, 0, internal_format, size, size, 0, GL_RGBA_INTEGER, GL_INT, 0);
		}
		std::vector<IVec4> pixels(csize * csize, IVec4(999));
		glTexSubImage2D(target, 0, 0, 0, csize, csize, GL_RGBA_INTEGER, GL_INT, &pixels[0]);

		IVec4 data[4] = { IVec4(12, 13, 14, 15), IVec4(8, 9, 10, 11), IVec4(0, 1, 2, 3), IVec4(4, 5, 6, 7) };

		glTexSubImage2D(target, 0, 22, 25, 2, 2, GL_RGBA_INTEGER, GL_INT, data);
		glTexSubImage2D(target, 0, 16, 10, 1, 1, GL_RGBA_INTEGER, GL_INT, data + 0);
		glTexSubImage2D(target, 0, 11, 2, 1, 1, GL_RGBA_INTEGER, GL_INT, data + 1);
		glTexSubImage2D(target, 0, 24, 13, 1, 1, GL_RGBA_INTEGER, GL_INT, data + 2);
		glTexSubImage2D(target, 0, 9, 14, 1, 1, GL_RGBA_INTEGER, GL_INT, data + 3);

		glTexParameteri(target, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(target, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	}